

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::X
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,
          TPZVec<double> *coordinate,TPZVec<double> *result)

{
  TPZFNMatrix<54,_double> cornerco;
  
  TPZFNMatrix<54,_double>::TPZFNMatrix(&cornerco,3,4);
  CornerCoordinates(this,&cornerco.super_TPZFMatrix<double>);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::X<double>
            (&this->fGeo,&cornerco.super_TPZFMatrix<double>,coordinate,result);
  TPZFNMatrix<54,_double>::~TPZFNMatrix(&cornerco);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<REAL> &coordinate,TPZVec<REAL> &result) const {
#ifdef PZDEBUG
    if(result.size() != 3) DebugStop();
#endif
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
	fGeo.X(cornerco,coordinate,result);
}